

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_ManCountThings(Au_Man_t *p)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  Au_Ntk_t *p_00;
  int *piVar5;
  void **ppvVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  Au_Ntk_t *pAVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 local_78 [72];
  
  iVar2 = (p->vNtks).nSize;
  if (1 < (long)iVar2) {
    ppvVar4 = (p->vNtks).pArray;
    lVar17 = (long)iVar2;
    do {
      p_00 = (Au_Ntk_t *)ppvVar4[lVar17 + -1];
      dVar20 = (double)(int)*(undefined8 *)(p_00->nObjs + 6);
      dVar21 = (double)(int)((ulong)*(undefined8 *)(p_00->nObjs + 6) >> 0x20);
      uVar18 = SUB84(dVar21,0);
      uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
      local_78._8_4_ = uVar18;
      local_78._0_8_ = dVar20;
      local_78._12_4_ = uVar19;
      auVar12._8_4_ = uVar18;
      auVar12._0_8_ = dVar20;
      auVar12._12_4_ = uVar19;
      p_00->nBoxes = dVar20;
      p_00->nNodes = (double)auVar12._8_8_;
      dVar20 = (double)(p_00->nObjs[3] + p_00->nObjs[2]);
      p_00->nPorts = dVar20;
      iVar13 = Au_NtkNodeNumFunc(p_00,1);
      dVar21 = (double)iVar13;
      p_00->nNodeAnds = dVar21;
      iVar13 = Au_NtkNodeNumFunc(p_00,2);
      dVar22 = (double)iVar13;
      p_00->nNodeXors = dVar22;
      iVar13 = Au_NtkNodeNumFunc(p_00,3);
      dVar23 = (double)iVar13;
      p_00->nNodeMuxs = dVar23;
      lVar14 = (long)(p_00->vObjs).nSize;
      if (0 < lVar14) {
        piVar5 = (p_00->vObjs).pArray;
        ppvVar6 = (p_00->vPages).pArray;
        lVar15 = 0;
        do {
          if (lVar14 == lVar15) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar3 = piVar5[lVar15];
          pvVar7 = ppvVar6[(int)uVar3 >> 0xc];
          uVar16 = (ulong)((uVar3 & 0xfff) << 4);
          uVar8 = *(ulong *)((long)pvVar7 + uVar16);
          if ((uVar8 & 0x700000000) == 0x600000000) {
            uVar16 = (long)pvVar7 + uVar16;
            lVar9 = *(long *)(*(long *)(uVar16 & 0xfffffffffffffc00) + 8);
            if (*(int *)(lVar9 + 0xc) <= (int)((uint)uVar8 & 0x3fffffff)) goto LAB_0085a84e;
            pAVar10 = *(Au_Ntk_t **)
                       (*(long *)(lVar9 + 0x10) + (ulong)((uint)uVar8 & 0x3fffffff) * 8);
            if ((pAVar10 != (Au_Ntk_t *)0x0) && (pAVar10 != p_00)) {
              if (pAVar10->nObjs[2] != (uint)(uVar8 >> 0x23)) {
                __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x200,"void Au_ManCountThings(Au_Man_t *)");
              }
              if (*(int *)(uVar16 + 8 + (uVar8 >> 0x23) * 4) != pAVar10->nObjs[3]) {
                __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x201,"void Au_ManCountThings(Au_Man_t *)");
              }
              if (pAVar10->Id <= p_00->Id) {
                __assert_fail("pBoxModel->Id > pNtk->Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x202,"void Au_ManCountThings(Au_Man_t *)");
              }
              dVar1 = pAVar10->nPorts;
              if (dVar1 <= 0.0) {
                __assert_fail("pBoxModel->nPorts > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x203,"void Au_ManCountThings(Au_Man_t *)");
              }
              local_78._0_8_ = (double)local_78._0_8_ + pAVar10->nBoxes;
              local_78._8_8_ = (double)local_78._8_8_ + pAVar10->nNodes;
              p_00->nBoxes = (double)local_78._0_8_;
              p_00->nNodes = (double)local_78._8_8_;
              dVar20 = dVar20 + dVar1;
              dVar21 = dVar21 + pAVar10->nNodeAnds;
              p_00->nPorts = dVar20;
              p_00->nNodeAnds = dVar21;
              dVar22 = dVar22 + pAVar10->nNodeXors;
              dVar23 = dVar23 + pAVar10->nNodeMuxs;
              p_00->nNodeXors = dVar22;
              p_00->nNodeMuxs = dVar23;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
      }
      bVar11 = 2 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar11);
    if (1 < iVar2) {
      pvVar7 = (p->vNtks).pArray[1];
      printf("Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n",
             (int)*(undefined8 *)((long)pvVar7 + 0xd8),*(undefined8 *)((long)pvVar7 + 0xd0),
             *(undefined8 *)((long)pvVar7 + 0xe0));
      printf("Total ANDs  = %15.0f.\n",(int)*(undefined8 *)((long)pvVar7 + 0xe8));
      printf("Total XORs  = %15.0f.\n",(int)*(undefined8 *)((long)pvVar7 + 0xf0));
      printf("Total MUXes = %15.0f.\n",(int)*(undefined8 *)((long)pvVar7 + 0xf8));
      return;
    }
  }
LAB_0085a84e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Au_ManCountThings( Au_Man_t * p )
{
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox;
    int i, k;//, clk = Abc_Clock();
    Au_ManForEachNtkReverse( p, pNtk, i )
    {
        pNtk->nBoxes = Au_NtkBoxNum(pNtk);
        pNtk->nNodes = Au_NtkNodeNum(pNtk);
        pNtk->nPorts = Au_NtkPiNum(pNtk) + Au_NtkPoNum(pNtk);
        pNtk->nNodeAnds = Au_NtkNodeNumFunc( pNtk, 1 );
        pNtk->nNodeXors = Au_NtkNodeNumFunc( pNtk, 2 );
        pNtk->nNodeMuxs = Au_NtkNodeNumFunc( pNtk, 3 );
//        assert( pNtk->nNodes == pNtk->nNodeAnds + pNtk->nNodeXors + pNtk->nNodeMuxs );
//        printf( "adding %.0f nodes of model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
            assert( pBoxModel->Id > pNtk->Id );
            assert( pBoxModel->nPorts > 0 );
            pNtk->nBoxes += pBoxModel->nBoxes;
            pNtk->nNodes += pBoxModel->nNodes;
            pNtk->nPorts += pBoxModel->nPorts;
            pNtk->nNodeAnds += pBoxModel->nNodeAnds;
            pNtk->nNodeXors += pBoxModel->nNodeXors;
            pNtk->nNodeMuxs += pBoxModel->nNodeMuxs;
//            printf( "    adding %.0f nodes of model %s\n", pBoxModel->nNodes, Au_NtkName(pBoxModel) );
        }
//        printf( "total %.0f nodes in model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
    }
    pNtk = Au_ManNtkRoot(p);
    printf( "Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n", 
//    printf( "Total nodes = %.2e. Total instances = %.2e. Total ports = %.2e.\n", 
        pNtk->nNodes, pNtk->nBoxes, pNtk->nPorts );
//    printf( "Total ANDs  = %15.0f. Total XORs      = %15.0f. Total MUXes = %15.0f.\n", 
//    printf( "Total ANDs  = %.2e. Total XORs      = %.2e. Total MUXes = %.2e.  ", 
//        pNtk->nNodeAnds, pNtk->nNodeXors, pNtk->nNodeMuxs );
    printf( "Total ANDs  = %15.0f.\n", pNtk->nNodeAnds );
    printf( "Total XORs  = %15.0f.\n", pNtk->nNodeXors );
    printf( "Total MUXes = %15.0f.\n", pNtk->nNodeMuxs );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}